

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseClassSpecifierList(Parser *this,bool allowSpecifiers)

{
  bool bVar1;
  Diagnostic *pDVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  long lVar3;
  BumpAllocator *dst;
  bool bVar4;
  SourceRange SVar5;
  string_view sVar6;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar7;
  Token ok;
  Token sk;
  ClassSpecifierSyntax *specifier;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> specifiers;
  
  specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.data_ =
       (pointer)specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.firstElement
  ;
  specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.len = 0;
  specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.cap = 5;
  bVar4 = false;
  do {
    bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
    if (!bVar1) {
      dst = (this->super_ParserBase).alloc;
      sVar7._M_ptr._0_4_ =
           SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::copy
                     (&specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>,
                      (EVP_PKEY_CTX *)dst,src);
      sVar7._M_ptr._4_4_ = extraout_var;
      SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::cleanup
                (&specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>,
                 (EVP_PKEY_CTX *)dst);
      sVar7._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      return sVar7;
    }
    specifier = parseClassSpecifier(this);
    if (((specifier->keyword).field_0x2 & 1) == 0) {
      if (specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.len == 0 &&
          !allowSpecifiers) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&specifier->super_SyntaxNode);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa30005,SVar5);
      }
      for (lVar3 = 0;
          specifiers.super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>.len * 8 != lVar3;
          lVar3 = lVar3 + 8) {
        sk.kind = (specifier->keyword).kind;
        sk._2_1_ = (specifier->keyword).field_0x2;
        sk.numFlags.raw = (specifier->keyword).numFlags.raw;
        sk.rawLen = (specifier->keyword).rawLen;
        sk.info = (specifier->keyword).info;
        ok._0_8_ = *(ulong *)(*(long *)((long)specifiers.
                                              super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>
                                              .data_ + lVar3) + 0x28);
        ok.info = *(Info **)(*(long *)((long)specifiers.
                                             super_SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>
                                             .data_ + lVar3) + 0x30);
        if (sk.kind == ok.kind) {
          SVar5 = Token::range(&sk);
          pDVar2 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x250005,SVar5);
          sVar6 = Token::valueText(&sk);
          pDVar2 = Diagnostic::operator<<(pDVar2,sVar6);
          SVar5 = Token::range(&ok);
          Diagnostic::operator<<(pDVar2,SVar5);
          break;
        }
        if (ok.kind == FinalKeyword && !bVar4) {
          SVar5 = Token::range(&ok);
          bVar4 = true;
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5b0005,SVar5);
          break;
        }
        if ((sk.kind != FinalKeyword && (ok._0_8_ & 0x10000) == 0) && ok.kind != FinalKeyword) {
          SVar5 = Token::range(&sk);
          pDVar2 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x80005,SVar5);
          sVar6 = Token::valueText(&sk);
          pDVar2 = Diagnostic::operator<<(pDVar2,sVar6);
          SVar5 = Token::range(&ok);
          pDVar2 = Diagnostic::operator<<(pDVar2,SVar5);
          sVar6 = Token::valueText(&ok);
          Diagnostic::operator<<(pDVar2,sVar6);
          break;
        }
      }
    }
    SmallVectorBase<slang::syntax::ClassSpecifierSyntax*>::
    emplace_back<slang::syntax::ClassSpecifierSyntax*const&>
              ((SmallVectorBase<slang::syntax::ClassSpecifierSyntax*> *)&specifiers,&specifier);
  } while( true );
}

Assistant:

std::span<syntax::ClassSpecifierSyntax*> Parser::parseClassSpecifierList(bool allowSpecifiers) {
    bool erroredOnFinal = false;
    SmallVector<ClassSpecifierSyntax*> specifiers;
    while (peek(TokenKind::Colon)) {
        auto specifier = parseClassSpecifier();
        SLANG_ASSERT(specifier);

        if (!specifier->keyword.isMissing()) {
            if (specifiers.empty() && !allowSpecifiers)
                addDiag(diag::SpecifiersNotAllowed, specifier->sourceRange());

            for (auto other : specifiers) {
                const auto sk = specifier->keyword;
                const auto ok = other->keyword;

                if (sk.kind == ok.kind) {
                    addDiag(diag::DuplicateClassSpecifier, sk.range())
                        << sk.valueText() << ok.range();
                    break;
                }

                if (ok.kind == TokenKind::FinalKeyword && !erroredOnFinal) {
                    erroredOnFinal = true;
                    addDiag(diag::FinalSpecifierLast, ok.range());
                    break;
                }

                if (!ok.isMissing() && ok.kind != TokenKind::FinalKeyword &&
                    sk.kind != TokenKind::FinalKeyword) {
                    addDiag(diag::ClassSpecifierConflict, sk.range())
                        << sk.valueText() << ok.range() << ok.valueText();
                    break;
                }
            }
        }

        specifiers.push_back(specifier);
    }

    return specifiers.copy(alloc);
}